

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.h
# Opt level: O0

DASHEventMessageBoxv1 * __thiscall
event_track::EventMessageInstanceBox::to_emsg_v1
          (DASHEventMessageBoxv1 *__return_storage_ptr__,EventMessageInstanceBox *this,
          uint64_t presentation_time)

{
  uint64_t presentation_time_local;
  EventMessageInstanceBox *this_local;
  DASHEventMessageBoxv1 *e;
  
  DASHEventMessageBoxv1::DASHEventMessageBoxv1(__return_storage_ptr__);
  *(undefined4 *)&(__return_storage_ptr__->super_full_box).field_0x6c =
       *(undefined4 *)&(this->super_full_box).field_0x6c;
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->scheme_id_uri_,(string *)&this->scheme_id_uri_);
  __return_storage_ptr__->event_duration_ = this->event_duration_;
  __return_storage_ptr__->id_ = this->id_;
  __return_storage_ptr__->presentation_time_ = this->presentation_time_delta_ + presentation_time;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->value_,(string *)&this->value_)
  ;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&__return_storage_ptr__->message_data_,&this->message_data_);
  return __return_storage_ptr__;
}

Assistant:

DASHEventMessageBoxv1 to_emsg_v1(uint64_t presentation_time)
		{
			DASHEventMessageBoxv1 e; 
			e.timescale_ = reserved_;
			e.scheme_id_uri_ = scheme_id_uri_;
			e.event_duration_ = event_duration_;
			e.id_ = id_;
			e.presentation_time_ = presentation_time_delta_ + presentation_time;
			e.value_ = value_;
			e.message_data_ = message_data_;
			return e;
		}